

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O3

REF_STATUS ref_metric_histogram(REF_DBL *metric,REF_GRID ref_grid,char *filename)

{
  REF_NODE pRVar1;
  double dVar2;
  uint uVar3;
  REF_DBL *original;
  REF_INT *sorted_index;
  FILE *__s;
  ulong uVar4;
  undefined8 uVar5;
  int iVar6;
  char *pcVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  REF_STATUS RVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  REF_DBL diag_system [12];
  undefined1 local_98 [16];
  double local_88;
  
  pRVar1 = ref_grid->node;
  uVar3 = pRVar1->n;
  uVar9 = (ulong)uVar3;
  if ((int)uVar3 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0xc55,
           "ref_metric_histogram","malloc eig of REF_DBL negative");
LAB_001d382a:
    RVar11 = 1;
  }
  else {
    original = (REF_DBL *)malloc(uVar9 * 8);
    if (original == (REF_DBL *)0x0) {
      pcVar7 = "malloc eig of REF_DBL NULL";
      uVar5 = 0xc55;
    }
    else {
      if (uVar3 != 0) {
        memset(original,0,uVar9 * 8);
      }
      sorted_index = (REF_INT *)malloc(uVar9 * 4);
      auVar14 = _DAT_00213060;
      if (sorted_index == (REF_INT *)0x0) {
        pcVar7 = "malloc sorted_index of REF_INT NULL";
        uVar5 = 0xc56;
      }
      else {
        if (uVar3 != 0) {
          lVar10 = uVar9 - 1;
          auVar13._8_4_ = (int)lVar10;
          auVar13._0_8_ = lVar10;
          auVar13._12_4_ = (int)((ulong)lVar10 >> 0x20);
          uVar4 = 0;
          auVar13 = auVar13 ^ _DAT_00213060;
          auVar15 = _DAT_00213ba0;
          auVar17 = _DAT_00213050;
          do {
            auVar18 = auVar17 ^ auVar14;
            iVar8 = auVar13._4_4_;
            if ((bool)(~(auVar18._4_4_ == iVar8 && auVar13._0_4_ < auVar18._0_4_ ||
                        iVar8 < auVar18._4_4_) & 1)) {
              sorted_index[uVar4] = -1;
            }
            if ((auVar18._12_4_ != auVar13._12_4_ || auVar18._8_4_ <= auVar13._8_4_) &&
                auVar18._12_4_ <= auVar13._12_4_) {
              sorted_index[uVar4 + 1] = -1;
            }
            auVar18 = auVar15 ^ auVar14;
            iVar6 = auVar18._4_4_;
            if (iVar6 <= iVar8 && (iVar6 != iVar8 || auVar18._0_4_ <= auVar13._0_4_)) {
              sorted_index[uVar4 + 2] = -1;
              sorted_index[uVar4 + 3] = -1;
            }
            uVar4 = uVar4 + 4;
            lVar10 = auVar17._8_8_;
            auVar17._0_8_ = auVar17._0_8_ + 4;
            auVar17._8_8_ = lVar10 + 4;
            lVar10 = auVar15._8_8_;
            auVar15._0_8_ = auVar15._0_8_ + 4;
            auVar15._8_8_ = lVar10 + 4;
          } while ((uVar3 + 3 & 0xfffffffc) != uVar4);
        }
        iVar8 = pRVar1->max;
        if (iVar8 < 1) {
          iVar6 = 0;
        }
        else {
          lVar10 = 0;
          iVar6 = 0;
          do {
            if (-1 < pRVar1->global[lVar10]) {
              uVar3 = ref_matrix_diag_m(metric,(REF_DBL *)local_98);
              if (uVar3 != 0) {
                pcVar7 = "decomp";
                uVar5 = 0xc59;
                goto LAB_001d3929;
              }
              auVar14._0_8_ = local_98._0_8_ ^ (ulong)DAT_00213010;
              auVar14._8_8_ = local_98._8_8_ ^ DAT_00213010._8_8_;
              auVar14 = maxpd(local_98,auVar14);
              dVar12 = auVar14._0_8_;
              if (auVar14._0_8_ <= auVar14._8_8_) {
                dVar12 = auVar14._8_8_;
              }
              dVar16 = (double)((ulong)local_88 ^ (ulong)DAT_00213010);
              dVar2 = local_88;
              if (local_88 <= dVar16) {
                dVar2 = dVar16;
              }
              if (dVar12 <= dVar2) {
                dVar12 = dVar2;
              }
              original[iVar6] = dVar12;
              iVar6 = iVar6 + 1;
              iVar8 = pRVar1->max;
            }
            lVar10 = lVar10 + 1;
            metric = metric + 6;
          } while (lVar10 < iVar8);
          uVar9 = (ulong)(uint)pRVar1->n;
        }
        iVar8 = (int)uVar9;
        if (iVar8 != iVar6) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0xc5f,"ref_metric_histogram","node count",(long)iVar8,(long)iVar6);
          goto LAB_001d382a;
        }
        uVar3 = ref_sort_heap_dbl(iVar8,original,sorted_index);
        if (uVar3 != 0) {
          pcVar7 = "sort";
          uVar5 = 0xc60;
LAB_001d3929:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 uVar5,"ref_metric_histogram",(ulong)uVar3,pcVar7);
          return uVar3;
        }
        __s = fopen(filename,"w");
        if (__s != (FILE *)0x0) {
          fwrite("title=\"tecplot ordered max eig\"\n",0x20,1,__s);
          fwrite("variables = \"i\" \"e\"\n",0x14,1,__s);
          fwrite("zone t=\"eig\"\n",0xd,1,__s);
          if (0 < iVar8) {
            uVar4 = 0;
            do {
              fprintf(__s,"%d %e\n",original[sorted_index[uVar4]],uVar4 & 0xffffffff);
              uVar4 = uVar4 + 1;
            } while (uVar9 != uVar4);
          }
          fclose(__s);
          free(sorted_index);
          free(original);
          return 0;
        }
        printf("unable to open %s\n",filename);
        pcVar7 = "unable to open file";
        uVar5 = 0xc64;
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar5,
           "ref_metric_histogram",pcVar7);
    RVar11 = 2;
  }
  return RVar11;
}

Assistant:

REF_FCN REF_STATUS ref_metric_histogram(REF_DBL *metric, REF_GRID ref_grid,
                                        const char *filename) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL *eig, diag_system[12];
  REF_INT i, node, n, *sorted_index;
  FILE *file;

  ref_malloc_init(eig, ref_node_n(ref_node), REF_DBL, 0.0);
  ref_malloc_init(sorted_index, ref_node_n(ref_node), REF_INT, REF_EMPTY);
  n = 0;
  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_matrix_diag_m(&(metric[6 * node]), diag_system), "decomp");
    eig[n] = MAX(MAX(ABS(ref_matrix_eig(diag_system, 0)),
                     ABS(ref_matrix_eig(diag_system, 1))),
                 ABS(ref_matrix_eig(diag_system, 2)));
    n++;
  }
  REIS(ref_node_n(ref_node), n, "node count");
  RSS(ref_sort_heap_dbl(n, eig, sorted_index), "sort");

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"tecplot ordered max eig\"\n");
  fprintf(file, "variables = \"i\" \"e\"\n");
  fprintf(file, "zone t=\"eig\"\n");
  for (i = 0; i < n; i++) {
    fprintf(file, "%d %e\n", i, eig[sorted_index[i]]);
  }
  fclose(file);
  ref_free(sorted_index);
  ref_free(eig);
  return REF_SUCCESS;
}